

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

void __thiscall
QUnicodeControlCharacterMenu::menuActionTriggered(QUnicodeControlCharacterMenu *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  QTextEdit *this_00;
  QLineEdit *this_01;
  long lVar4;
  uint uVar5;
  long in_FS_OFFSET;
  QList<QAction_*> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::sender();
  lVar3 = QMetaObject::cast((QObject *)&QAction::staticMetaObject);
  QWidget::actions(&local_38,(QWidget *)this);
  uVar5 = 0xffffffff;
  if ((undefined1 *)local_38.d.size != (undefined1 *)0x0) {
    lVar4 = -8;
    do {
      if (local_38.d.size * -8 + lVar4 == -8) goto LAB_004c9715;
      lVar1 = lVar4 + 8;
      lVar2 = lVar4 + 8;
      lVar4 = lVar1;
    } while (*(long *)((long)local_38.d.ptr + lVar2) != lVar3);
    uVar5 = (uint)(lVar1 >> 3);
  }
LAB_004c9715:
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (uVar5 < 0xe) {
    local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)&local_38,
                     (QChar)(char16_t)
                            *(undefined4 *)
                             ((long)&qt_controlCharacters[0].character + (ulong)((uVar5 & 0xf) << 4)
                             ));
    this_00 = (QTextEdit *)QMetaObject::cast((QObject *)&QTextEdit::staticMetaObject);
    if (this_00 == (QTextEdit *)0x0) {
      lVar3 = QMetaObject::cast((QObject *)&QWidgetTextControl::staticMetaObject);
      if (lVar3 != 0) {
        QTextCursor::insertText((QString *)(*(long *)(lVar3 + 8) + 0x88));
      }
      this_01 = (QLineEdit *)QMetaObject::cast((QObject *)&QLineEdit::staticMetaObject);
      if (this_01 != (QLineEdit *)0x0) {
        QLineEdit::insert(this_01,(QString *)&local_38);
      }
    }
    else {
      QTextEdit::insertPlainText(this_00,(QString *)&local_38);
    }
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUnicodeControlCharacterMenu::menuActionTriggered()
{
    QAction *a = qobject_cast<QAction *>(sender());
    int idx = actions().indexOf(a);
    if (idx < 0 || idx >= NUM_CONTROL_CHARACTERS)
        return;
    QChar c(qt_controlCharacters[idx].character);
    QString str(c);

#if QT_CONFIG(textedit)
    if (QTextEdit *edit = qobject_cast<QTextEdit *>(editWidget)) {
        edit->insertPlainText(str);
        return;
    }
#endif
    if (QWidgetTextControl *control = qobject_cast<QWidgetTextControl *>(editWidget)) {
        control->insertPlainText(str);
    }
#if QT_CONFIG(lineedit)
    if (QLineEdit *edit = qobject_cast<QLineEdit *>(editWidget)) {
        edit->insert(str);
        return;
    }
#endif
}